

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

ModportPortSymbol *
slang::ast::ModportPortSymbol::fromSyntax
          (ASTContext *context,ArgumentDirection direction,ModportNamedPortSyntax *syntax)

{
  Compilation *this;
  SourceLocation loc;
  undefined8 uVar1;
  undefined4 uVar2;
  bitmask<slang::ast::ASTFlags> bVar3;
  bool bVar4;
  ModportPortSymbol *pMVar5;
  Symbol *pSVar6;
  DeclaredType *target;
  Expression *expr;
  Diagnostic *this_00;
  DiagCode code;
  string_view sVar7;
  SourceRange SVar8;
  string_view name_00;
  LookupLocation location;
  undefined1 isDottedAccess;
  ArgumentDirection direction_local;
  ASTContext *local_b8;
  Compilation *local_b0;
  char *local_a8;
  Scope *local_a0;
  SourceRange local_98;
  Token name;
  SourceLocation local_70;
  ASTContext checkCtx;
  
  this = ((context->scope).ptr)->compilation;
  name.kind = (syntax->name).kind;
  name._2_1_ = (syntax->name).field_0x2;
  name.numFlags.raw = (syntax->name).numFlags.raw;
  name.rawLen = (syntax->name).rawLen;
  name.info = (syntax->name).info;
  direction_local = direction;
  checkCtx._0_16_ = parsing::Token::valueText(&name);
  local_70 = parsing::Token::location(&name);
  local_b0 = this;
  pMVar5 = BumpAllocator::
           emplace<slang::ast::ModportPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&>
                     (&this->super_BumpAllocator,
                      (basic_string_view<char,_std::char_traits<char>_> *)&checkCtx,&local_70,
                      &direction_local);
  (pMVar5->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  local_a0 = (context->scope).ptr;
  sVar7 = parsing::Token::valueText(&name);
  local_a8 = sVar7._M_str;
  uVar1 = context->scope;
  uVar2 = context->lookupIndex;
  location.index = uVar2;
  location.scope = (Scope *)uVar1;
  local_b8 = context;
  local_98 = parsing::Token::range(&name);
  isDottedAccess = local_98.endLoc._0_1_;
  name_00._M_str = local_a8;
  name_00._M_len = sVar7._M_len;
  location._12_4_ = 0;
  pSVar6 = Lookup::unqualifiedAt
                     (local_a0,name_00,location,local_98,(bitmask<slang::ast::LookupFlags>)0x40);
  pMVar5->internalSymbol = pSVar6;
  if (pSVar6 != (Symbol *)0x0) {
    code.subsystem = Declarations;
    code.code = 0x36;
    if (pSVar6->kind != Subroutine) {
      bVar4 = SemanticFacts::isAllowedInModport(pSVar6->kind);
      code.subsystem = Declarations;
      code.code = 0x8f;
      if (bVar4) {
        if (pMVar5->internalSymbol != (Symbol *)0x0) {
          target = Symbol::getDeclaredType(pMVar5->internalSymbol);
          DeclaredType::setLink(&(pMVar5->super_ValueSymbol).declaredType,target);
          ASTContext::resetFlags(&checkCtx,local_b8,(bitmask<slang::ast::ASTFlags>)0x100000020);
          bVar3 = checkCtx.flags;
          if ((direction_local != In) &&
             (bVar3.m_bits = checkCtx.flags.m_bits | 0x100000, direction_local == InOut)) {
            bVar3.m_bits = checkCtx.flags.m_bits | 0x4000100000;
          }
          checkCtx.flags.m_bits = bVar3.m_bits;
          loc = (pMVar5->super_ValueSymbol).super_Symbol.location;
          SVar8.startLoc =
               (pMVar5->super_ValueSymbol).super_Symbol.name._M_len * 0x10000000 + (long)loc;
          SVar8.endLoc = (SourceLocation)0x0;
          expr = ValueExpressionBase::fromSymbol
                           ((ValueExpressionBase *)&checkCtx,(ASTContext *)pMVar5->internalSymbol,
                            (Symbol *)0x0,(HierarchicalReference *)loc,SVar8,false,
                            (bool)isDottedAccess);
          Expression::checkConnectionDirection
                    (expr,direction_local,&checkCtx,loc,(bitmask<slang::ast::AssignFlags>)0x0);
          pMVar5->connExpr = expr;
          return pMVar5;
        }
        goto LAB_001ec612;
      }
    }
    SVar8 = parsing::Token::range(&name);
    this_00 = ASTContext::addDiag(local_b8,code,SVar8);
    sVar7 = parsing::Token::valueText(&name);
    Diagnostic::operator<<(this_00,sVar7);
    Diagnostic::addNote(this_00,(DiagCode)0x50001,pMVar5->internalSymbol->location);
    pMVar5->internalSymbol = (Symbol *)0x0;
  }
LAB_001ec612:
  (pMVar5->super_ValueSymbol).declaredType.type = local_b0->errorType;
  return pMVar5;
}

Assistant:

ModportPortSymbol& ModportPortSymbol::fromSyntax(const ASTContext& context,
                                                 ArgumentDirection direction,
                                                 const ModportNamedPortSyntax& syntax) {
    auto& comp = context.getCompilation();
    auto name = syntax.name;
    auto result = comp.emplace<ModportPortSymbol>(name.valueText(), name.location(), direction);
    result->setSyntax(syntax);
    result->internalSymbol = Lookup::unqualifiedAt(*context.scope, name.valueText(),
                                                   context.getLocation(), name.range(),
                                                   LookupFlags::NoParentScope);

    if (result->internalSymbol) {
        if (result->internalSymbol->kind == SymbolKind::Subroutine) {
            auto& diag = context.addDiag(diag::ExpectedImportExport, name.range());
            diag << name.valueText();
            diag.addNote(diag::NoteDeclarationHere, result->internalSymbol->location);
            result->internalSymbol = nullptr;
        }
        else if (!SemanticFacts::isAllowedInModport(result->internalSymbol->kind)) {
            auto& diag = context.addDiag(diag::NotAllowedInModport, name.range());
            diag << name.valueText();
            diag.addNote(diag::NoteDeclarationHere, result->internalSymbol->location);
            result->internalSymbol = nullptr;
        }
    }

    if (!result->internalSymbol) {
        result->setType(comp.getErrorType());
        return *result;
    }

    auto sourceType = result->internalSymbol->getDeclaredType();
    SLANG_ASSERT(sourceType);
    result->getDeclaredType()->setLink(*sourceType);

    // Perform checking on the connected symbol to make sure it's allowed
    // given the modport's direction.
    ASTContext checkCtx = context.resetFlags(ASTFlags::NonProcedural | ASTFlags::NotADriver);
    if (direction != ArgumentDirection::In) {
        checkCtx.flags |= ASTFlags::LValue;
        if (direction == ArgumentDirection::InOut)
            checkCtx.flags |= ASTFlags::LAndRValue;
    }

    auto loc = result->location;
    auto& expr = ValueExpressionBase::fromSymbol(checkCtx, *result->internalSymbol, nullptr,
                                                 {loc, loc + result->name.length()});

    Expression::checkConnectionDirection(expr, direction, checkCtx, loc);

    result->connExpr = &expr;
    return *result;
}